

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

logical pnga_overlay(Integer g_a,Integer g_parent)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  C_Integer *pCVar7;
  Integer IVar8;
  Integer IVar9;
  logical lVar10;
  Integer *pIVar11;
  global_array_t *pgVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long grp_id;
  C_Integer CVar20;
  global_array_t *pgVar21;
  bool bVar22;
  Integer local_1d8;
  ulong local_1c8;
  global_array_t *local_1c0;
  Integer local_1b8;
  long local_1b0;
  Integer hi [7];
  Integer dims [7];
  Integer blk [7];
  Integer chunk [7];
  Integer pe [7];
  Integer width [7];
  
  lVar1 = g_a + 1000;
  local_1b8 = GAme;
  local_1d8 = GAnproc;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (GA[lVar1].ndim == -1) {
    pnga_error("Insufficient data to create global array",0);
  }
  iVar3 = GA_Default_Proc_Group;
  iVar18 = GA[lVar1].p_handle;
  if (GA[lVar1].p_handle == GA_Init_Proc_Group) {
    GA[lVar1].p_handle = GA_Default_Proc_Group;
    iVar18 = iVar3;
  }
  grp_id = (long)iVar18;
  pnga_pgroup_sync(grp_id);
  lVar17 = (g_parent + 1000) * 0x368;
  if (iVar18 != GA[g_parent + 1000].p_handle) {
    pnga_error("Parent and overlay global array must be on same procesor group",0);
  }
  if (0 < iVar18) {
    local_1d8 = (Integer)PGRP_LIST[grp_id].map_nproc;
    local_1b8 = (Integer)PGRP_LIST[grp_id].map_proc_list[GAme];
  }
  if (GAinitialized == '\0') {
    pnga_error("GA not initialized ",0);
  }
  local_1b0 = lVar17;
  if (ma_address_init == '\0') {
    gai_ma_address_init();
  }
  uVar2 = GA[lVar1].ndim;
  lVar19 = (long)(short)uVar2;
  lVar5 = 0;
  lVar17 = 0;
  if (0 < lVar19) {
    lVar17 = lVar19;
  }
  for (; lVar17 != lVar5; lVar5 = lVar5 + 1) {
    width[lVar5] = GA[g_a + 1000].width[lVar5];
  }
  pCVar7 = GA[lVar1].mapc;
  if (GA[lVar1].distr_type == 0 && pCVar7 == (C_Integer *)0x0) {
    for (lVar5 = 0; lVar17 != lVar5; lVar5 = lVar5 + 1) {
      dims[lVar5] = GA[g_a + 1000].dims[lVar5];
      chunk[lVar5] = GA[g_a + 1000].chunk[lVar5];
    }
    if (CONCAT44(chunk[0]._4_4_,(undefined4)chunk[0]) == 0) {
      for (lVar5 = 0; lVar17 != lVar5; lVar5 = lVar5 + 1) {
        blk[lVar5] = -1;
      }
    }
    else {
      for (lVar5 = 0; lVar17 != lVar5; lVar5 = lVar5 + 1) {
        lVar14 = dims[lVar5];
        if (chunk[lVar5] < dims[lVar5]) {
          lVar14 = chunk[lVar5];
        }
        blk[lVar5] = lVar14;
      }
    }
    for (lVar5 = 0; lVar17 != lVar5; lVar5 = lVar5 + 1) {
      if (dims[lVar5] == 1) {
        blk[lVar5] = 1;
      }
    }
    pnga_pgroup_sync(grp_id);
    if (iVar18 == 0) {
      lVar5 = (long)PGRP_LIST->map_nproc;
    }
    else {
      lVar5 = GA[lVar1].num_rstrctd;
      if (GA[lVar1].num_rstrctd == 0) {
        lVar5 = local_1d8;
      }
    }
    ddb_h2(lVar19,dims,lVar5,0.0,0,blk,pe);
    pIVar11 = mapALL;
    for (lVar5 = 0; pgVar12 = GA, lVar5 != lVar17; lVar5 = lVar5 + 1) {
      lVar19 = chunk[lVar5];
      lVar14 = dims[lVar5];
      if (lVar19 < 2) {
        IVar9 = pe[lVar5];
        lVar14 = lVar14 - (blk[lVar5] + -1) * IVar9;
      }
      else {
        lVar6 = lVar14;
        if (lVar19 < lVar14) {
          lVar6 = lVar19;
        }
        IVar9 = pe[lVar5];
        lVar14 = (lVar14 + -1) / lVar6 + (1 - blk[lVar5]) * IVar9 + 1;
      }
      lVar6 = 0;
      for (lVar13 = 0; (lVar6 < IVar9 && (lVar13 < dims[lVar5])); lVar13 = lVar13 + lVar15) {
        lVar15 = blk[lVar5] - (ulong)(lVar14 <= lVar6);
        pIVar11[lVar6] = lVar13 + 1;
        if (1 < lVar19) {
          lVar16 = dims[lVar5];
          if (lVar19 < dims[lVar5]) {
            lVar16 = lVar19;
          }
          lVar15 = lVar15 * lVar16;
        }
        lVar6 = lVar6 + 1;
        IVar9 = pe[lVar5];
      }
      if (IVar9 < lVar6) {
        lVar6 = IVar9;
      }
      pe[lVar5] = lVar6;
      pIVar11 = pIVar11 + lVar6;
    }
    lVar19 = 0;
    for (lVar5 = 0; lVar17 != lVar5; lVar5 = lVar5 + 1) {
      lVar14 = pe[lVar5];
      pgVar12[g_a + 1000].nblock[lVar5] = (int)lVar14;
      lVar19 = lVar19 + lVar14;
    }
    pCVar7 = (C_Integer *)malloc(lVar19 * 8 + 8);
    GA[lVar1].mapc = pCVar7;
    pIVar11 = mapALL;
    pgVar12 = GA + lVar1;
    lVar14 = 0;
    lVar5 = 0;
    if (0 < lVar19) {
      lVar5 = lVar19;
    }
    for (; pgVar21 = GA, lVar5 != lVar14; lVar14 = lVar14 + 1) {
      pgVar12->mapc[lVar14] = pIVar11[lVar14];
    }
    GA[lVar1].mapc[lVar19] = -1;
    lVar5 = 0;
    goto LAB_0015f7bc;
  }
  pgVar21 = GA;
  switch(GA[lVar1].distr_type) {
  case 1:
    lVar14 = GA[lVar1].block_total;
    lVar5 = 0;
    uVar4 = 0;
    if (0 < (short)uVar2) {
      uVar4 = uVar2;
    }
    for (IVar9 = GAme; IVar9 < lVar14; IVar9 = IVar9 + GAnproc) {
      lVar15 = (long)(int)IVar9 % GA[lVar1].num_blocks[0];
      chunk[0]._0_4_ = (int)lVar15;
      lVar6 = IVar9;
      lVar13 = 0;
      while (lVar13 + 1 < lVar19) {
        lVar6 = (long)((int)lVar6 - (int)lVar15) / GA[g_a + 1000].num_blocks[lVar13];
        lVar15 = (long)(int)lVar6 % GA[g_a + 1000].num_blocks[lVar13 + 1];
        *(int *)((long)chunk + lVar13 * 4 + 4) = (int)lVar15;
        lVar13 = lVar13 + 1;
      }
      for (lVar6 = 0; (ulong)uVar4 * 4 != lVar6; lVar6 = lVar6 + 4) {
        iVar3 = *(int *)((long)chunk + lVar6);
        lVar13 = *(long *)((long)GA[g_a + 1000].block_dims + lVar6 * 2);
        *(long *)((long)dims + lVar6 * 2) = lVar13 * iVar3 + 1;
        lVar13 = ((long)iVar3 + 1) * lVar13;
        lVar15 = *(long *)((long)GA[g_a + 1000].dims + lVar6 * 2);
        if (lVar15 <= lVar13) {
          lVar13 = lVar15;
        }
        *(long *)((long)hi + lVar6 * 2) = lVar13;
      }
      lVar6 = 1;
      for (lVar13 = 0; lVar17 != lVar13; lVar13 = lVar13 + 1) {
        lVar6 = lVar6 * ((hi[lVar13] - dims[lVar13]) + 1);
      }
      lVar5 = lVar5 + lVar6;
    }
    goto LAB_0015f74e;
  case 2:
    lVar14 = GAme % (long)GA[lVar1].nblock[0];
    hi[0] = lVar14;
    IVar9 = GAme;
    lVar5 = 0;
    while (lVar5 + 1 < lVar19) {
      IVar9 = (IVar9 - lVar14) / (long)GA[g_a + 1000].nblock[lVar5];
      lVar14 = IVar9 % (long)GA[g_a + 1000].nblock[lVar5 + 1];
      hi[lVar5 + 1] = lVar14;
      lVar5 = lVar5 + 1;
    }
    lVar5 = 1;
    for (lVar19 = 0; lVar19 != lVar17; lVar19 = lVar19 + 1) {
      lVar6 = 0;
      for (lVar14 = hi[lVar19]; lVar14 < GA[lVar1].num_blocks[lVar19];
          lVar14 = lVar14 + GA[lVar1].nblock[lVar19]) {
        lVar13 = (lVar14 + 1) * GA[lVar1].block_dims[lVar19];
        if (GA[lVar1].dims[lVar19] <= lVar13) {
          lVar13 = GA[lVar1].dims[lVar19];
        }
        lVar6 = (lVar6 - GA[lVar1].block_dims[lVar19] * lVar14) + lVar13;
      }
      lVar5 = lVar5 * lVar6;
    }
    break;
  case 3:
    lVar14 = GAme % (long)GA[lVar1].nblock[0];
    hi[0] = lVar14;
    IVar9 = GAme;
    lVar5 = 0;
    while (lVar5 + 1 < lVar19) {
      IVar9 = (IVar9 - lVar14) / (long)GA[g_a + 1000].nblock[lVar5];
      lVar14 = IVar9 % (long)GA[g_a + 1000].nblock[lVar5 + 1];
      hi[lVar5 + 1] = lVar14;
      lVar5 = lVar5 + 1;
    }
    lVar5 = 1;
    for (lVar19 = 0; lVar19 != lVar17; lVar19 = lVar19 + 1) {
      lVar6 = 0;
      for (lVar14 = hi[lVar19]; lVar14 < GA[lVar1].num_blocks[lVar19];
          lVar14 = lVar14 + GA[lVar1].nblock[lVar19]) {
        lVar13 = (lVar14 + 1) * GA[lVar1].block_dims[lVar19];
        if (GA[lVar1].dims[lVar19] <= lVar13) {
          lVar13 = GA[lVar1].dims[lVar19];
        }
        lVar6 = (lVar6 - GA[lVar1].block_dims[lVar19] * lVar14) + lVar13;
      }
      lVar5 = lVar5 * lVar6;
    }
    break;
  case 4:
    lVar5 = 1;
    lVar6 = GAme % (long)GA[lVar1].nblock[0];
    hi[0] = lVar6;
    IVar9 = GAme;
    lVar14 = 0;
    while (lVar14 + 1 < lVar19) {
      IVar9 = (IVar9 - lVar6) / (long)GA[g_a + 1000].nblock[lVar14];
      lVar6 = IVar9 % (long)GA[g_a + 1000].nblock[lVar14 + 1];
      hi[lVar14 + 1] = lVar6;
      lVar14 = lVar14 + 1;
    }
    lVar14 = 0;
    for (lVar19 = 0; lVar19 != lVar17; lVar19 = lVar19 + 1) {
      lVar6 = GA[lVar1].num_blocks[lVar19];
      lVar13 = 0;
      for (IVar9 = hi[lVar19]; IVar9 < lVar6; IVar9 = IVar9 + GA[lVar1].nblock[lVar19]) {
        if (IVar9 < lVar6 + -1) {
          CVar20 = pCVar7[lVar14 + IVar9 + 1] + -1;
        }
        else {
          CVar20 = GA[lVar1].dims[lVar19];
        }
        lVar13 = (lVar13 - pCVar7[lVar14 + IVar9]) + CVar20 + 1;
      }
      lVar5 = lVar5 * lVar13;
      lVar14 = lVar14 + lVar6;
    }
LAB_0015f74e:
    local_1c0 = GA;
    break;
  default:
    lVar5 = 0;
  }
LAB_0015f7bc:
  GAstat.numcre = GAstat.numcre + 1;
  pgVar21[lVar1].actv = 1;
  IVar8 = pnga_cluster_nnodes();
  IVar9 = local_1b8;
  pgVar12 = GA;
  if ((IVar8 == 1) && (GA[lVar1].p_handle == 0)) {
    GA[lVar1].p_handle = -1;
  }
  if (pgVar12[lVar1].distr_type == 0) {
    for (lVar5 = 0; lVar17 != lVar5; lVar5 = lVar5 + 1) {
      pgVar12[g_a + 1000].scale[lVar5] =
           (double)pgVar12[g_a + 1000].nblock[lVar5] / (double)pgVar12[g_a + 1000].dims[lVar5];
    }
    pnga_set_ghost_corner_flag(g_a,lVar17);
    if (iVar18 == 0) {
      IVar9 = (Integer)PGRP_LIST->map_proc_list[GAme];
    }
    pnga_distribution(g_a,IVar9,GA[lVar1].lo,hi);
    if ((GA[lVar1].num_rstrctd == 0) || (GA[lVar1].has_data == 1)) {
      lVar19 = 1;
      for (lVar5 = 0; lVar17 != lVar5; lVar5 = lVar5 + 1) {
        lVar19 = lVar19 * ((hi[lVar5] - GA[g_a + 1000].lo[lVar5]) + width[lVar5] * 2 + 1);
      }
    }
    else {
      lVar19 = 0;
    }
    lVar5 = (long)GA[lVar1].elemsize;
    pgVar12 = GA;
  }
  else {
    lVar19 = (long)pgVar12[lVar1].elemsize;
    for (lVar14 = 0; lVar17 != lVar14; lVar14 = lVar14 + 1) {
      pgVar12[lVar1].scale[lVar14] =
           (double)pgVar12[lVar1].num_blocks[lVar14] / (double)pgVar12[lVar1].dims[lVar14];
    }
  }
  lVar14 = local_1b0;
  lVar5 = lVar5 * lVar19;
  pgVar12[lVar1].id = -1;
  pgVar12[lVar1].size = lVar5;
  lVar17 = *(long *)((long)pgVar12->dims + local_1b0 + -0x20);
  local_1c8 = (ulong)(lVar5 - lVar17 == 0 || lVar5 < lVar17);
  IVar9 = pnga_type_f2c(0x3f2);
  if (iVar18 < 1) {
    pnga_gop(IVar9,&local_1c8,1,"&&");
  }
  else {
    pnga_pgroup_gop(grp_id,IVar9,&local_1c8,1,"&&");
  }
  pgVar12 = GA;
  if (local_1c8 != 0) {
    GA[lVar1].overlay = 1;
    pgVar12[lVar1].id = *(long *)((long)pgVar12->dims + lVar14 + -8);
    lVar17 = 0;
    if (local_1d8 < 1) {
      local_1d8 = lVar17;
    }
    for (; local_1d8 != lVar17; lVar17 = lVar17 + 1) {
      GA[lVar1].ptr[lVar17] = *(char **)(*(long *)(GA->name + lVar14 + -0x10) + lVar17 * 8);
    }
  }
  if (((GA[lVar1].distr_type == 0) && (GA[lVar1].ghosts == 1)) &&
     (lVar10 = pnga_set_ghost_info(g_a), lVar10 == 0)) {
    pnga_error("Could not allocate update information for ghost cells",0);
  }
  pnga_pgroup_sync(grp_id);
  bVar22 = local_1c8 == 0;
  if (bVar22) {
    pnga_destroy(g_a);
  }
  return (ulong)!bVar22;
}

Assistant:

logical pnga_overlay(Integer g_a, Integer g_parent)
{

  Integer hi[MAXDIM];
  Integer ga_handle = g_a + GA_OFFSET;
  Integer g_p = g_parent + GA_OFFSET;
  Integer d, width[MAXDIM], ndim;
  Integer mem_size, nelem;
  Integer i, status, maplen=0, p_handle;
  Integer dims[MAXDIM], chunk[MAXDIM];
  Integer pe[MAXDIM], *pmap[MAXDIM], *map;
  Integer blk[MAXDIM];
  Integer grp_me=GAme, grp_nproc=GAnproc;
  Integer block_size = 0;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  if (GA[ga_handle].ndim == -1)
    pnga_error("Insufficient data to create global array",0);

  p_handle = (Integer)GA[ga_handle].p_handle;
  if (p_handle == (Integer)GA_Init_Proc_Group) {
    GA[ga_handle].p_handle = GA_Default_Proc_Group;
    p_handle = GA_Default_Proc_Group;
  }
  pnga_pgroup_sync(p_handle);
  if (p_handle != (Integer)GA[g_p].p_handle) {
    pnga_error("Parent and overlay global array must be on same procesor group",0);
  }

  if (p_handle > 0) {
     grp_nproc  = PGRP_LIST[p_handle].map_nproc;
     grp_me = PGRP_LIST[p_handle].map_proc_list[GAme];
  }
  
  if(!GAinitialized) pnga_error("GA not initialized ", 0);
  if(!ma_address_init) gai_ma_address_init();

  ndim = GA[ga_handle].ndim;
  for (i=0; i<ndim; i++) width[i] = (C_Integer)GA[ga_handle].width[i];

  /* The data distribution has not been specified by the user. Create
     default distribution */
  if (GA[ga_handle].mapc == NULL && GA[ga_handle].distr_type == REGULAR) {
    for (d=0; d<ndim; d++) {
      dims[d] = (Integer)GA[ga_handle].dims[d];
      chunk[d] = (Integer)GA[ga_handle].chunk[d];
    }
    if(chunk[0]!=0) /* for chunk[0]=0 compute all */
      for(d=0; d< ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for(d=0; d< ndim; d++) blk[d]=-1;

    /* eliminate dimensions =1 from ddb analysis */
    for(d=0; d<ndim; d++)if(dims[d]==1)blk[d]=1;
 
    if (GAme==0 && DEBUG )
      for (d=0;d<ndim;d++) fprintf(stderr,"b[%ld]=%ld\n",(long)d,(long)blk[d]);
    pnga_pgroup_sync(p_handle);

    /* ddb(ndim, dims, GAnproc, blk, pe);*/
    if(p_handle == 0) /* for mirrored arrays */
#if OLD_DISTRIBUTION
       ddb_h2(ndim, dims, PGRP_LIST[p_handle].map_nproc,0.0,(Integer)0, blk, pe);
#else
       ddb(ndim, dims, PGRP_LIST[p_handle].map_nproc, blk, pe);
#endif
    else
       if (GA[ga_handle].num_rstrctd == 0) {
         /* Data is normally distributed on processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, grp_nproc,0.0,(Integer)0, blk, pe);
#else
         ddb(ndim, dims, grp_nproc, blk, pe);
#endif
       } else {
         /* Data is only distributed on subset of processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, GA[ga_handle].num_rstrctd, 0.0, (Integer)0, blk, pe);
#else
         ddb(ndim, dims, GA[ga_handle].num_rstrctd, blk, pe);
#endif
       }

    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       but respect the users block size */
      
      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      }
      else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d]; 
    }
    if(GAme==0&& DEBUG){
      gai_print_subscript("pe ",(int)ndim, pe,"\n");
      gai_print_subscript("blocks ",(int)ndim, blk,"\n");
      printf("decomposition map\n");
      for(d=0; d< ndim; d++){
        printf("dim=%ld: ",(long)d); 
        for (i=0;i<pe[d];i++)printf("%ld ",(long)pmap[d][i]);
        printf("\n"); 
      }
      fflush(stdout);
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    /* Regular block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer nblocks = GA[ga_handle].block_total;
    Integer tsize, j;
    Integer lo[MAXDIM];
    block_size = 0;
    for (i=GAme; i<nblocks; i +=GAnproc) {
      ga_ownsM(ga_handle,i,lo,hi);
      tsize = 1;
      for (j=0; j<ndim; j++) {
        tsize *= (hi[j] - lo[j] + 1);
      }
      block_size += tsize;
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK) {
    /* ScaLAPACK block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    gam_find_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    Integer offset = 0;
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = GA[ga_handle].mapc[offset+j];
        if (j<GA[ga_handle].num_blocks[i]-1) {
          imax = GA[ga_handle].mapc[offset+j+1]-1;
        } else {
          imax = GA[ga_handle].dims[i];
        }
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
      offset += GA[ga_handle].num_blocks[i];
    }
  }

  GAstat.numcre ++;

  GA[ga_handle].actv = 1;
  /* If only one node is being used and array is mirrored,
   * set proc list to world group */
  if (pnga_cluster_nnodes() == 1 && GA[ga_handle].p_handle == 0) {
    GA[ga_handle].p_handle = pnga_pgroup_get_world();
  }

  /* Set remaining parameters and determine memory size if regular data
   * distribution is being used */
  if (GA[ga_handle].distr_type == REGULAR) {
    /* set corner flag, if it has not already been set and set up message
       passing data */
    if (GA[ga_handle].corner_flag == -1) {
       i = 1;
    } else {
       i = GA[ga_handle].corner_flag;
    }
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
         / (double)GA[ga_handle].dims[i];
    }
    pnga_set_ghost_corner_flag(g_a, i);
 
    /*** determine which portion of the array I am supposed to hold ***/
    if (p_handle == 0) { /* for mirrored arrays */
       Integer me_local = (Integer)PGRP_LIST[p_handle].map_proc_list[GAme];
       pnga_distribution(g_a, me_local, GA[ga_handle].lo, hi);
    } else {
       pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    }
    if (GA[ga_handle].num_rstrctd == 0 || GA[ga_handle].has_data == 1) {
      for( i = 0, nelem=1; i< ndim; i++){
        /*
        GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
        */
        nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1+2*width[i]);
      }
    } else {
      nelem = 0;
    }
    mem_size = nelem * GA[ga_handle].elemsize;
  } else {
    mem_size = block_size * GA[ga_handle].elemsize;
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].num_blocks[i]
         / (double)GA[ga_handle].dims[i];
    }
  }
  GA[ga_handle].id = INVALID_MA_HANDLE;
  GA[ga_handle].size = (C_Long)mem_size;
  /* check if everybody has enough memory to fit overlay GA */
  status = (GA[ga_handle].size <= GA[g_p].size) ? 1 : 0;
  if (p_handle > 0) {
    pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
  } else {
    pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
  }

  if (status) {
    GA[ga_handle].overlay = 1;
    GA[ga_handle].id = GA[g_p].id;
    for (i=0; i<grp_nproc; i++) {
      GA[ga_handle].ptr[i] = GA[g_p].ptr[i];
    }
  }

  if (GA[ga_handle].distr_type == REGULAR) {
    /* Finish setting up information for ghost cell updates */
    if (GA[ga_handle].ghosts == 1) {
      if (!pnga_set_ghost_info(g_a))
        pnga_error("Could not allocate update information for ghost cells",0);
    }
    /* If array is mirrored, evaluate first and last indices */
    /* ngai_get_first_last_indices(&g_a); */
  }

  pnga_pgroup_sync(p_handle);
  if (status) {
    status = TRUE;
  } else {
    pnga_destroy(g_a);
    status = FALSE;
  }
  return status;
}